

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook.c
# Opt level: O1

int funchook_uninstall(funchook_t *funchook,int flags)

{
  undefined4 *puVar1;
  bool bVar2;
  uint uVar3;
  funchook_entry_t *pfVar4;
  funchook_page_t *page;
  ulong uVar5;
  bool bVar6;
  uint local_44;
  mem_state_t local_40;
  
  funchook_log(funchook,"Enter funchook_uninstall(%p, 0x%x)\n",funchook,flags);
  if (funchook->installed == 0) {
    local_44 = 10;
  }
  else {
    page = (funchook_page_t *)&funchook->page_list;
    do {
      page = page->next;
      if (page == (funchook_page_t *)0x0) {
        funchook->installed = 0;
        local_44 = 0;
        break;
      }
      bVar6 = page->used != 0;
      if (bVar6) {
        pfVar4 = page->entries;
        bVar6 = true;
        uVar5 = 0;
        do {
          uVar3 = funchook_unprotect_begin(funchook,&local_40,pfVar4->target_func,5);
          if (uVar3 == 0) {
            puVar1 = (undefined4 *)pfVar4->target_func;
            *(uint8_t *)(puVar1 + 1) = pfVar4->old_code[4];
            *puVar1 = *(undefined4 *)pfVar4->old_code;
            uVar3 = funchook_unprotect_end(funchook,&local_40);
            if (uVar3 != 0) goto LAB_001017db;
            bVar2 = true;
          }
          else {
LAB_001017db:
            bVar2 = false;
            local_44 = uVar3;
          }
          if (!bVar2) goto LAB_00101810;
          uVar5 = uVar5 + 1;
          pfVar4 = pfVar4 + 1;
          bVar6 = uVar5 < page->used;
        } while (bVar6);
      }
      funchook_page_unprotect(funchook,page);
LAB_00101810:
    } while (!bVar6);
  }
  funchook_log_end((funchook_t *)0x0,"Leave funchook_uninstall() => %d\n",(ulong)local_44);
  return local_44;
}

Assistant:

int funchook_uninstall(funchook_t *funchook, int flags)
{
    int rv;

    funchook_log(funchook, "Enter funchook_uninstall(%p, 0x%x)\n", funchook, flags);
    rv = funchook_uninstall_internal(funchook, flags);
    funchook_log_end(NULL, "Leave funchook_uninstall() => %d\n", rv);
    return rv;
}